

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O2

int JetHead::File::pipe(int *__pipedes)

{
  int iVar1;
  ErrCode EVar2;
  int in_RAX [2];
  File *pFVar3;
  int *piVar4;
  int fds [2];
  
  fds = in_RAX;
  iVar1 = ::pipe(fds);
  if (iVar1 == -1) {
    piVar4 = __errno_location();
    EVar2 = getErrorCode(*piVar4);
  }
  else {
    pFVar3 = (File *)operator_new(0x40,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/File.cpp"
                                  ,0x137);
    File(pFVar3,fds[0]);
    *(File **)__pipedes = pFVar3;
    pFVar3 = (File *)operator_new(0x40,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/File.cpp"
                                  ,0x138);
    File(pFVar3,fds[1]);
    *(File **)(__pipedes + 2) = pFVar3;
    EVar2 = kNoError;
  }
  return EVar2;
}

Assistant:

JetHead::ErrCode	File::pipe( File *pipe_files[ 2 ] )
{
	int fds[ 2 ];
	int res = ::pipe( fds );

	if ( res == -1 )
		return 	getErrorCode( errno );

	pipe_files[ 0 ] = jh_new File( fds[ 0 ] );
	pipe_files[ 1 ] = jh_new File( fds[ 1 ] );

	return kNoError;
}